

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx2::OrientedDiscMiMBIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  float fVar80;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined4 uStack_334;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  RTCFilterFunctionNArguments local_2d0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  uint local_260 [4];
  uint uStack_250;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar13 = context->scene;
  local_260[0] = Disc->sharedGeomID;
  pGVar14 = (pSVar13->geometries).items[local_260[0]].ptr;
  fVar3 = (pGVar14->time_range).lower;
  fVar80 = pGVar14->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar3) / ((pGVar14->time_range).upper - fVar3));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),9);
  auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
  auVar18 = vmaxss_avx(ZEXT816(0) << 0x20,auVar53);
  iVar41 = (int)auVar18._0_4_;
  uVar43 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar15 = *(long *)&pGVar14[2].numPrimitives;
  lVar44 = (long)iVar41 * 0x38;
  lVar16 = *(long *)(lVar15 + 0x10 + lVar44);
  lVar51 = *(long *)(lVar15 + lVar44);
  uVar47 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar49 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar50 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar46 = (ulong)(Disc->primIDs).field_0.i[4];
  puVar1 = (undefined8 *)(lVar51 + lVar16 * uVar46);
  local_320._16_8_ = *puVar1;
  local_320._0_16_ = *(undefined1 (*) [16])(lVar51 + lVar16 * uVar43);
  local_320._24_8_ = puVar1[1];
  uVar42 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar53 = *(undefined1 (*) [16])(lVar51 + lVar16 * uVar42);
  auVar81._16_16_ = auVar53;
  auVar81._0_16_ = *(undefined1 (*) [16])(lVar51 + lVar16 * uVar47);
  uVar48 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar51 + lVar16 * uVar48);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar51 + lVar16 * uVar49);
  uVar45 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar51 + lVar16 * uVar45);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar51 + lVar16 * uVar50);
  p_Var17 = pGVar14[2].intersectionFilterN;
  lVar16 = *(long *)(p_Var17 + lVar44);
  lVar51 = *(long *)(p_Var17 + lVar44 + 0x10);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar46);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar43);
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar42);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar47);
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar48);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar49);
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar45);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar51 * uVar50);
  lVar51 = (long)(iVar41 + 1) * 0x38;
  lVar16 = *(long *)(lVar15 + lVar51);
  lVar15 = *(long *)(lVar15 + 0x10 + lVar51);
  auVar89._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar46);
  auVar89._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar43);
  auVar90._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar42);
  auVar90._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar47);
  auVar92._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar48);
  auVar92._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar49);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar45);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar50);
  lVar15 = *(long *)(p_Var17 + lVar51);
  lVar16 = *(long *)(p_Var17 + lVar51 + 0x10);
  pauVar2 = (undefined1 (*) [12])(lVar15 + uVar47 * lVar16);
  uStack_334 = (undefined4)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar15 + uVar46 * lVar16);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar15 + uVar43 * lVar16);
  fVar80 = fVar80 - auVar18._0_4_;
  auVar58 = vunpcklps_avx(local_320,auVar61);
  auVar19 = vunpckhps_avx(local_320,auVar61);
  auVar61 = vunpcklps_avx(auVar81,auVar62);
  auVar62 = vunpckhps_avx(auVar81,auVar62);
  auVar21 = vunpcklps_avx(auVar58,auVar61);
  auVar55 = vunpckhps_avx(auVar58,auVar61);
  auVar81 = vunpcklps_avx(auVar66,auVar74);
  auVar58 = vunpckhps_avx(auVar66,auVar74);
  auVar66 = vunpcklps_avx(auVar69,auVar78);
  auVar61 = vunpckhps_avx(auVar69,auVar78);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar15 + uVar48 * lVar16);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar15 + uVar49 * lVar16);
  auVar22 = vunpcklps_avx(auVar58,auVar61);
  auVar63 = vunpcklps_avx(auVar81,auVar66);
  auVar58 = vunpckhps_avx(auVar81,auVar66);
  auVar61 = vunpcklps_avx(auVar89,auVar92);
  auVar81 = vunpckhps_avx(auVar89,auVar92);
  auVar23 = vunpcklps_avx(auVar90,auVar59);
  auVar66 = vunpckhps_avx(auVar90,auVar59);
  auVar24 = vunpcklps_avx(auVar61,auVar23);
  auVar23 = vunpckhps_avx(auVar61,auVar23);
  auVar59 = vunpcklps_avx(auVar54,auVar70);
  auVar61 = vunpckhps_avx(auVar54,auVar70);
  auVar75._12_4_ = uStack_334;
  auVar75._0_12_ = *pauVar2;
  auVar75._16_16_ = *(undefined1 (*) [16])(lVar15 + uVar42 * lVar16);
  auVar71._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar45);
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar15 + uVar50 * lVar16);
  auVar54 = vunpcklps_avx(auVar75,auVar71);
  auVar20 = vunpckhps_avx(auVar75,auVar71);
  auVar20 = vunpcklps_avx(auVar61,auVar20);
  auVar60 = vunpcklps_avx(auVar59,auVar54);
  auVar61 = vunpckhps_avx(auVar59,auVar54);
  fVar3 = 1.0 - fVar80;
  auVar76._4_4_ = fVar3;
  auVar76._0_4_ = fVar3;
  auVar76._8_4_ = fVar3;
  auVar76._12_4_ = fVar3;
  auVar76._16_4_ = fVar3;
  auVar76._20_4_ = fVar3;
  auVar76._24_4_ = fVar3;
  auVar76._28_4_ = fVar3;
  auVar72._0_4_ = fVar80 * auVar24._0_4_;
  auVar72._4_4_ = fVar80 * auVar24._4_4_;
  auVar72._8_4_ = fVar80 * auVar24._8_4_;
  auVar72._12_4_ = fVar80 * auVar24._12_4_;
  auVar72._16_4_ = fVar80 * auVar24._16_4_;
  auVar72._20_4_ = fVar80 * auVar24._20_4_;
  auVar72._24_4_ = fVar80 * auVar24._24_4_;
  auVar72._28_4_ = 0;
  auVar18 = vfmadd231ps_fma(auVar72,auVar76,auVar21);
  auVar21._4_4_ = fVar80 * auVar60._4_4_;
  auVar21._0_4_ = fVar80 * auVar60._0_4_;
  auVar21._8_4_ = fVar80 * auVar60._8_4_;
  auVar21._12_4_ = fVar80 * auVar60._12_4_;
  auVar21._16_4_ = fVar80 * auVar60._16_4_;
  auVar21._20_4_ = fVar80 * auVar60._20_4_;
  auVar21._24_4_ = fVar80 * auVar60._24_4_;
  auVar21._28_4_ = 0;
  auVar60._0_4_ = fVar80 * auVar61._0_4_;
  auVar60._4_4_ = fVar80 * auVar61._4_4_;
  auVar60._8_4_ = fVar80 * auVar61._8_4_;
  auVar60._12_4_ = fVar80 * auVar61._12_4_;
  auVar60._16_4_ = fVar80 * auVar61._16_4_;
  auVar60._20_4_ = fVar80 * auVar61._20_4_;
  auVar60._24_4_ = fVar80 * auVar61._24_4_;
  auVar60._28_4_ = 0;
  auVar24._4_4_ = fVar80 * auVar20._4_4_;
  auVar24._0_4_ = fVar80 * auVar20._0_4_;
  auVar24._8_4_ = fVar80 * auVar20._8_4_;
  auVar24._12_4_ = fVar80 * auVar20._12_4_;
  auVar24._16_4_ = fVar80 * auVar20._16_4_;
  auVar24._20_4_ = fVar80 * auVar20._20_4_;
  auVar24._24_4_ = fVar80 * auVar20._24_4_;
  auVar24._28_4_ = auVar61._28_4_;
  auVar25 = vfmadd231ps_fma(auVar21,auVar76,auVar63);
  auVar26 = vfmadd231ps_fma(auVar60,auVar76,auVar58);
  auVar27 = vfmadd231ps_fma(auVar24,auVar76,auVar22);
  bVar12 = Disc->numPrimitives;
  local_260[1] = local_260[0];
  local_260[2] = local_260[0];
  local_260[3] = local_260[0];
  uStack_250 = local_260[0];
  uStack_24c = local_260[0];
  uStack_248 = local_260[0];
  uStack_244 = local_260[0];
  fVar3 = *(float *)(ray + k * 4 + 0x80);
  local_2a0._4_4_ = fVar3;
  local_2a0._0_4_ = fVar3;
  local_2a0._8_4_ = fVar3;
  local_2a0._12_4_ = fVar3;
  local_2a0._16_4_ = fVar3;
  local_2a0._20_4_ = fVar3;
  local_2a0._24_4_ = fVar3;
  local_2a0._28_4_ = fVar3;
  fVar4 = *(float *)(ray + k * 4 + 0xa0);
  local_280._4_4_ = fVar4;
  local_280._0_4_ = fVar4;
  local_280._8_4_ = fVar4;
  local_280._12_4_ = fVar4;
  local_280._16_4_ = fVar4;
  local_280._20_4_ = fVar4;
  local_280._24_4_ = fVar4;
  local_280._28_4_ = fVar4;
  fVar5 = *(float *)(ray + k * 4 + 0xc0);
  auVar58._4_4_ = auVar27._4_4_ * fVar5;
  auVar58._0_4_ = auVar27._0_4_ * fVar5;
  auVar58._8_4_ = auVar27._8_4_ * fVar5;
  auVar58._12_4_ = auVar27._12_4_ * fVar5;
  auVar58._16_4_ = fVar5 * 0.0;
  auVar58._20_4_ = fVar5 * 0.0;
  auVar58._24_4_ = fVar5 * 0.0;
  auVar58._28_4_ = fVar5;
  auVar28 = vfmadd231ps_fma(auVar58,local_280,ZEXT1632(auVar26));
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),local_2a0,ZEXT1632(auVar25));
  auVar63._8_4_ = 0x3f800000;
  auVar63._0_8_ = &DAT_3f8000003f800000;
  auVar63._12_4_ = 0x3f800000;
  auVar63._16_4_ = 0x3f800000;
  auVar63._20_4_ = 0x3f800000;
  auVar63._24_4_ = 0x3f800000;
  auVar63._28_4_ = 0x3f800000;
  auVar61 = vcmpps_avx(ZEXT1632(auVar28),ZEXT432(0) << 0x20,4);
  auVar58 = vblendvps_avx(auVar63,ZEXT1632(auVar28),auVar61);
  auVar20._4_4_ = fVar80 * auVar23._4_4_;
  auVar20._0_4_ = fVar80 * auVar23._0_4_;
  auVar20._8_4_ = fVar80 * auVar23._8_4_;
  auVar20._12_4_ = fVar80 * auVar23._12_4_;
  auVar20._16_4_ = fVar80 * auVar23._16_4_;
  auVar20._20_4_ = fVar80 * auVar23._20_4_;
  auVar20._24_4_ = fVar80 * auVar23._24_4_;
  auVar20._28_4_ = auVar23._28_4_;
  auVar28 = vfmadd231ps_fma(auVar20,auVar76,auVar55);
  auVar55 = vunpcklps_avx(auVar81,auVar66);
  auVar23._4_4_ = fVar80 * auVar55._4_4_;
  auVar23._0_4_ = fVar80 * auVar55._0_4_;
  auVar23._8_4_ = fVar80 * auVar55._8_4_;
  auVar23._12_4_ = fVar80 * auVar55._12_4_;
  auVar23._16_4_ = fVar80 * auVar55._16_4_;
  auVar23._20_4_ = fVar80 * auVar55._20_4_;
  auVar23._24_4_ = fVar80 * auVar55._24_4_;
  auVar23._28_4_ = auVar81._28_4_;
  auVar55 = vunpcklps_avx(auVar19,auVar62);
  auVar29 = vfmadd231ps_fma(auVar23,auVar76,auVar55);
  fVar6 = *(float *)(ray + k * 4 + 0x40);
  auVar55._4_4_ = fVar6;
  auVar55._0_4_ = fVar6;
  auVar55._8_4_ = fVar6;
  auVar55._12_4_ = fVar6;
  auVar55._16_4_ = fVar6;
  auVar55._20_4_ = fVar6;
  auVar55._24_4_ = fVar6;
  auVar55._28_4_ = fVar6;
  auVar55 = vsubps_avx(ZEXT1632(auVar29),auVar55);
  auVar22._4_4_ = auVar27._4_4_ * auVar55._4_4_;
  auVar22._0_4_ = auVar27._0_4_ * auVar55._0_4_;
  auVar22._8_4_ = auVar27._8_4_ * auVar55._8_4_;
  auVar22._12_4_ = auVar27._12_4_ * auVar55._12_4_;
  auVar22._16_4_ = auVar55._16_4_ * 0.0;
  auVar22._20_4_ = auVar55._20_4_ * 0.0;
  auVar22._24_4_ = auVar55._24_4_ * 0.0;
  auVar22._28_4_ = auVar53._12_4_;
  fVar7 = *(float *)(ray + k * 4 + 0x20);
  auVar64._4_4_ = fVar7;
  auVar64._0_4_ = fVar7;
  auVar64._8_4_ = fVar7;
  auVar64._12_4_ = fVar7;
  auVar64._16_4_ = fVar7;
  auVar64._20_4_ = fVar7;
  auVar64._24_4_ = fVar7;
  auVar64._28_4_ = fVar7;
  auVar55 = vsubps_avx(ZEXT1632(auVar28),auVar64);
  auVar53 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar26),auVar55);
  fVar8 = *(float *)(ray + k * 4);
  auVar67._4_4_ = fVar8;
  auVar67._0_4_ = fVar8;
  auVar67._8_4_ = fVar8;
  auVar67._12_4_ = fVar8;
  auVar67._16_4_ = fVar8;
  auVar67._20_4_ = fVar8;
  auVar67._24_4_ = fVar8;
  auVar67._28_4_ = fVar8;
  auVar55 = vsubps_avx(ZEXT1632(auVar18),auVar67);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),ZEXT1632(auVar25),auVar55);
  local_200 = vdivps_avx(ZEXT1632(auVar53),auVar58);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar91._4_4_ = uVar9;
  auVar91._0_4_ = uVar9;
  auVar91._8_4_ = uVar9;
  auVar91._12_4_ = uVar9;
  auVar91._16_4_ = uVar9;
  auVar91._20_4_ = uVar9;
  auVar91._24_4_ = uVar9;
  auVar91._28_4_ = uVar9;
  auVar58 = vcmpps_avx(auVar91,local_200,2);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar93._4_4_ = uVar9;
  auVar93._0_4_ = uVar9;
  auVar93._8_4_ = uVar9;
  auVar93._12_4_ = uVar9;
  auVar93._16_4_ = uVar9;
  auVar93._20_4_ = uVar9;
  auVar93._24_4_ = uVar9;
  auVar93._28_4_ = uVar9;
  auVar55 = vcmpps_avx(local_200,auVar93,2);
  auVar58 = vandps_avx(auVar55,auVar58);
  auVar94._1_3_ = 0;
  auVar94[0] = bVar12;
  auVar94[4] = bVar12;
  auVar94._5_3_ = 0;
  auVar94[8] = bVar12;
  auVar94._9_3_ = 0;
  auVar94[0xc] = bVar12;
  auVar94._13_3_ = 0;
  auVar94[0x10] = bVar12;
  auVar94._17_3_ = 0;
  auVar94[0x14] = bVar12;
  auVar94._21_3_ = 0;
  auVar94[0x18] = bVar12;
  auVar94._25_3_ = 0;
  auVar94[0x1c] = bVar12;
  auVar94._29_3_ = 0;
  auVar55 = vpcmpgtd_avx2(auVar94,_DAT_0205a920);
  auVar58 = vandps_avx(auVar58,auVar55);
  auVar55 = auVar61 & auVar58;
  if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar55 >> 0x7f,0) != '\0') ||
        (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar55 >> 0xbf,0) != '\0') ||
      (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar55[0x1f] < '\0') {
    auVar55 = vunpckhps_avx(auVar19,auVar62);
    auVar19 = vunpckhps_avx(auVar81,auVar66);
    auVar31._4_4_ = fVar80 * auVar19._4_4_;
    auVar31._0_4_ = fVar80 * auVar19._0_4_;
    auVar31._8_4_ = fVar80 * auVar19._8_4_;
    auVar31._12_4_ = fVar80 * auVar19._12_4_;
    auVar31._16_4_ = fVar80 * auVar19._16_4_;
    auVar31._20_4_ = fVar80 * auVar19._20_4_;
    auVar31._24_4_ = fVar80 * auVar19._24_4_;
    auVar31._28_4_ = fVar80;
    auVar30 = vfmadd231ps_fma(auVar31,auVar76,auVar55);
    auVar58 = vandps_avx(auVar58,auVar61);
    auVar53 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
    fVar80 = local_200._0_4_;
    fVar83 = local_200._4_4_;
    fVar84 = local_200._8_4_;
    fVar85 = local_200._12_4_;
    fVar86 = local_200._16_4_;
    fVar87 = local_200._20_4_;
    fVar88 = local_200._24_4_;
    auVar68._0_4_ = fVar80 * fVar3 + fVar8;
    auVar68._4_4_ = fVar83 * fVar3 + fVar8;
    auVar68._8_4_ = fVar84 * fVar3 + fVar8;
    auVar68._12_4_ = fVar85 * fVar3 + fVar8;
    auVar68._16_4_ = fVar86 * fVar3 + fVar8;
    auVar68._20_4_ = fVar87 * fVar3 + fVar8;
    auVar68._24_4_ = fVar88 * fVar3 + fVar8;
    auVar68._28_4_ = fVar8 + 0.0;
    auVar65._0_4_ = fVar80 * fVar4 + fVar7;
    auVar65._4_4_ = fVar83 * fVar4 + fVar7;
    auVar65._8_4_ = fVar84 * fVar4 + fVar7;
    auVar65._12_4_ = fVar85 * fVar4 + fVar7;
    auVar65._16_4_ = fVar86 * fVar4 + fVar7;
    auVar65._20_4_ = fVar87 * fVar4 + fVar7;
    auVar65._24_4_ = fVar88 * fVar4 + fVar7;
    auVar65._28_4_ = fVar7 + 0.0;
    auVar56._0_4_ = fVar80 * fVar5 + fVar6;
    auVar56._4_4_ = fVar83 * fVar5 + fVar6;
    auVar56._8_4_ = fVar84 * fVar5 + fVar6;
    auVar56._12_4_ = fVar85 * fVar5 + fVar6;
    auVar56._16_4_ = fVar86 * fVar5 + fVar6;
    auVar56._20_4_ = fVar87 * fVar5 + fVar6;
    auVar56._24_4_ = fVar88 * fVar5 + fVar6;
    auVar56._28_4_ = fVar6 + 0.0;
    auVar58 = vsubps_avx(auVar68,ZEXT1632(auVar18));
    auVar61 = vsubps_avx(auVar65,ZEXT1632(auVar28));
    auVar55 = vsubps_avx(auVar56,ZEXT1632(auVar29));
    auVar19._4_4_ = auVar55._4_4_ * auVar55._4_4_;
    auVar19._0_4_ = auVar55._0_4_ * auVar55._0_4_;
    auVar19._8_4_ = auVar55._8_4_ * auVar55._8_4_;
    auVar19._12_4_ = auVar55._12_4_ * auVar55._12_4_;
    auVar19._16_4_ = auVar55._16_4_ * auVar55._16_4_;
    auVar19._20_4_ = auVar55._20_4_ * auVar55._20_4_;
    auVar19._24_4_ = auVar55._24_4_ * auVar55._24_4_;
    auVar19._28_4_ = auVar55._28_4_;
    auVar18 = vfmadd231ps_fma(auVar19,auVar61,auVar61);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar58,auVar58);
    auVar32._28_4_ = auVar61._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar30._12_4_ * auVar30._12_4_,
                            CONCAT48(auVar30._8_4_ * auVar30._8_4_,
                                     CONCAT44(auVar30._4_4_ * auVar30._4_4_,
                                              auVar30._0_4_ * auVar30._0_4_))));
    auVar58 = vcmpps_avx(ZEXT1632(auVar18),auVar32,1);
    auVar18 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
    auVar53 = vpand_avx(auVar18,auVar53);
    auVar58 = vpmovzxwd_avx2(auVar53);
    auVar58 = vpslld_avx2(auVar58,0x1f);
    if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar58 >> 0x7f,0) != '\0') ||
          (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar58 >> 0xbf,0) != '\0') ||
        (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar58[0x1f] < '\0')
    {
      auVar73 = ZEXT864(0) << 0x20;
      local_220 = ZEXT832(0) << 0x20;
      local_240 = ZEXT832(0) << 0x20;
      local_1e0 = ZEXT1632(auVar25);
      local_1c0 = ZEXT1632(auVar26);
      local_1a0 = ZEXT1632(auVar27);
      auVar53 = vpsllw_avx(auVar53,0xf);
      auVar53 = vpacksswb_avx(auVar53,auVar53);
      uVar50 = (ulong)(byte)(SUB161(auVar53 >> 7,0) & 1 | (SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar53 >> 0x37,0) & 1) << 6 | SUB161(auVar53 >> 0x3f,0) << 7);
      iVar41 = 1 << ((uint)k & 0x1f);
      auVar57._4_4_ = iVar41;
      auVar57._0_4_ = iVar41;
      auVar57._8_4_ = iVar41;
      auVar57._12_4_ = iVar41;
      auVar57._16_4_ = iVar41;
      auVar57._20_4_ = iVar41;
      auVar57._24_4_ = iVar41;
      auVar57._28_4_ = iVar41;
      auVar61 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar58 = vpand_avx2(auVar57,auVar61);
      auVar58 = vpcmpeqd_avx2(auVar58,auVar61);
      auVar77 = ZEXT3264(auVar58);
      auVar58 = vpcmpeqd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar30));
      auVar79 = ZEXT3264(auVar58);
      auVar82 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      do {
        local_2d0.hit = local_180;
        local_2d0.valid = (int *)local_300;
        uVar43 = 0;
        for (uVar42 = uVar50; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
          uVar43 = uVar43 + 1;
        }
        local_c0 = local_260[uVar43];
        pGVar14 = (pSVar13->geometries).items[local_c0].ptr;
        if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar50 = uVar50 ^ 1L << (uVar43 & 0x3f);
          bVar52 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar52 = false;
        }
        else {
          uVar42 = (ulong)(uint)((int)uVar43 * 4);
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_120 = *(undefined4 *)(local_240 + uVar42);
          uVar10 = *(undefined4 *)(local_220 + uVar42);
          local_100._4_4_ = uVar10;
          local_100._0_4_ = uVar10;
          local_100._8_4_ = uVar10;
          local_100._12_4_ = uVar10;
          local_100._16_4_ = uVar10;
          local_100._20_4_ = uVar10;
          local_100._24_4_ = uVar10;
          local_100._28_4_ = uVar10;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar42);
          local_2d0.context = context->user;
          uVar10 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar42);
          local_e0._4_4_ = uVar10;
          local_e0._0_4_ = uVar10;
          local_e0._8_4_ = uVar10;
          local_e0._12_4_ = uVar10;
          local_e0._16_4_ = uVar10;
          local_e0._20_4_ = uVar10;
          local_e0._24_4_ = uVar10;
          local_e0._28_4_ = uVar10;
          uVar10 = *(undefined4 *)(local_1e0 + uVar42);
          uVar11 = *(undefined4 *)(local_1c0 + uVar42);
          local_160._4_4_ = uVar11;
          local_160._0_4_ = uVar11;
          local_160._8_4_ = uVar11;
          local_160._12_4_ = uVar11;
          local_160._16_4_ = uVar11;
          local_160._20_4_ = uVar11;
          local_160._24_4_ = uVar11;
          local_160._28_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_1a0 + uVar42);
          local_140._4_4_ = uVar11;
          local_140._0_4_ = uVar11;
          local_140._8_4_ = uVar11;
          local_140._12_4_ = uVar11;
          local_140._16_4_ = uVar11;
          local_140._20_4_ = uVar11;
          local_140._24_4_ = uVar11;
          local_140._28_4_ = uVar11;
          local_180[0] = (RTCHitN)(char)uVar10;
          local_180[1] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar10;
          local_180[5] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar10;
          local_180[9] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar10;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar10;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar10;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar10;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar10;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar10 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_bc = local_c0;
          uStack_b8 = local_c0;
          uStack_b4 = local_c0;
          uStack_b0 = local_c0;
          uStack_ac = local_c0;
          uStack_a8 = local_c0;
          uStack_a4 = local_c0;
          uStack_9c = (local_2d0.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_2d0.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          auVar58 = auVar77._0_32_;
          local_2d0.geometryUserPtr = pGVar14->userPtr;
          local_2d0.N = 8;
          local_300 = auVar58;
          local_2d0.ray = (RTCRayN *)ray;
          if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar61 = ZEXT1632(auVar79._0_16_);
            (*pGVar14->occlusionFilterN)(&local_2d0);
            auVar82 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
            auVar79 = ZEXT3264(auVar61);
            auVar77 = ZEXT3264(auVar58);
            auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar61 = vpcmpeqd_avx2(auVar73._0_32_,local_300);
          auVar58 = auVar79._0_32_ & ~auVar61;
          if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar58 >> 0x7f,0) == '\0') &&
                (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar58 >> 0xbf,0) == '\0') &&
              (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar58[0x1f]) {
            auVar61 = auVar79._0_32_ ^ auVar61;
          }
          else {
            p_Var17 = context->args->filter;
            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
              auVar58 = ZEXT1632(auVar79._0_16_);
              (*p_Var17)(&local_2d0);
              auVar82 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
              auVar79 = ZEXT3264(auVar58);
              auVar77 = ZEXT3264(auVar77._0_32_);
              auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar58 = vpcmpeqd_avx2(auVar73._0_32_,local_300);
            auVar61 = auVar79._0_32_ ^ auVar58;
            auVar58 = vblendvps_avx(auVar82._0_32_,*(undefined1 (*) [32])(local_2d0.ray + 0x100),
                                    auVar58);
            *(undefined1 (*) [32])(local_2d0.ray + 0x100) = auVar58;
          }
          bVar39 = (auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar40 = (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar38 = (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar37 = SUB321(auVar61 >> 0x7f,0) == '\0';
          bVar36 = (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar35 = SUB321(auVar61 >> 0xbf,0) == '\0';
          bVar34 = (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar33 = -1 < auVar61[0x1f];
          bVar52 = ((((((bVar39 && bVar40) && bVar38) && bVar37) && bVar36) && bVar35) && bVar34) &&
                   bVar33;
          if (((((((bVar39 && bVar40) && bVar38) && bVar37) && bVar36) && bVar35) && bVar34) &&
              bVar33) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
            uVar50 = uVar50 ^ 1L << (uVar43 & 0x3f);
          }
        }
      } while ((uVar50 != 0) && (bVar52 != false));
      return (bool)(bVar52 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }